

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

int av1_is_integer_mv(YV12_BUFFER_CONFIG *cur_picture,YV12_BUFFER_CONFIG *last_picture,
                     ForceIntegerMVInfo *force_intpel_info)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int y_start;
  uint uVar12;
  uint8_t *puVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int y_pos;
  uint8_t *puVar17;
  long lVar18;
  int x_pos;
  int x_start;
  bool bVar19;
  bool bVar20;
  double dVar21;
  int local_58;
  int local_54;
  
  iVar5 = (cur_picture->field_1).field_0.y_height;
  local_58 = 0;
  local_54 = 0;
  iVar16 = 0;
  if (7 < iVar5) {
    iVar6 = (cur_picture->field_0).field_0.y_width;
    iVar16 = 0;
    local_54 = 0;
    local_58 = 0;
    y_start = 0;
    iVar8 = 8;
    do {
      if (7 < iVar6) {
        iVar10 = 8;
        x_start = 0;
        do {
          iVar9 = iVar10;
          iVar10 = (cur_picture->field_4).field_0.y_stride;
          iVar7 = (last_picture->field_4).field_0.y_stride;
          puVar13 = (cur_picture->field_5).buffers[0] + (iVar10 * y_start + x_start);
          puVar17 = (last_picture->field_5).buffers[0] + (iVar7 * y_start + x_start);
          if ((cur_picture->flags & 8) == 0) {
            uVar12 = 0;
            do {
              uVar15 = 0;
              do {
                puVar1 = puVar13 + uVar15;
                puVar2 = puVar17 + uVar15;
                bVar20 = *puVar1 == *puVar2;
                if (!bVar20) break;
                bVar19 = uVar15 < 7;
                uVar15 = uVar15 + 1;
              } while (bVar19);
              if (*puVar1 != *puVar2) break;
              puVar13 = puVar13 + iVar10;
              puVar17 = puVar17 + iVar7;
              bVar19 = uVar12 < 7;
              uVar12 = uVar12 + 1;
            } while (bVar19);
          }
          else {
            lVar14 = (long)puVar13 * 2;
            lVar18 = (long)puVar17 * 2;
            uVar12 = 0;
            do {
              uVar15 = 0;
              do {
                sVar3 = *(short *)(lVar14 + uVar15 * 2);
                sVar4 = *(short *)(lVar18 + uVar15 * 2);
                bVar20 = sVar3 == sVar4;
                if (!bVar20) break;
                bVar19 = uVar15 < 7;
                uVar15 = uVar15 + 1;
              } while (bVar19);
              if (sVar3 != sVar4) break;
              lVar18 = lVar18 + (long)iVar7 * 2;
              lVar14 = lVar14 + (long)iVar10 * 2;
              bVar19 = uVar12 < 7;
              uVar12 = uVar12 + 1;
            } while (bVar19);
          }
          if (bVar20) {
            local_54 = local_54 + 1;
          }
          else {
            iVar10 = av1_hash_is_horizontal_perfect(cur_picture,8,x_start,y_start);
            if ((iVar10 != 0) ||
               (iVar10 = av1_hash_is_vertical_perfect(cur_picture,8,x_start,y_start), iVar10 != 0))
            {
              local_58 = local_58 + 1;
            }
          }
          iVar16 = iVar16 + 1;
          iVar10 = iVar9 + 8;
          x_start = iVar9;
        } while (iVar10 <= iVar6);
      }
      iVar10 = iVar8 + 8;
      y_start = iVar8;
      iVar8 = iVar10;
    } while (iVar10 <= iVar5);
  }
  dVar21 = (double)(local_58 + local_54) / (double)iVar16;
  iVar5 = force_intpel_info->rate_index;
  force_intpel_info->cs_rate_array[iVar5] = dVar21;
  uVar12 = iVar5 + 0x20;
  if (-1 < (int)(iVar5 + 1U)) {
    uVar12 = iVar5 + 1U;
  }
  force_intpel_info->rate_index = (iVar5 - (uVar12 & 0xffffffe0)) + 1;
  uVar12 = 0x20;
  if (force_intpel_info->rate_size < 0x1f) {
    uVar12 = force_intpel_info->rate_size + 1;
  }
  force_intpel_info->rate_size = uVar12;
  if (0.8 <= dVar21) {
    if (local_54 == iVar16) {
      uVar11 = 1;
    }
    else {
      if ((int)uVar12 < 1) {
        dVar21 = 0.0;
      }
      else {
        dVar21 = 0.0;
        uVar15 = 0;
        do {
          dVar21 = dVar21 + force_intpel_info->cs_rate_array[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      uVar11 = 0;
      if ((0.95 <= dVar21 / (double)(int)uVar12) &&
         (uVar11 = 1, -1 < iVar16 - (local_58 + local_54))) {
        uVar11 = (uint)(1.01 < dVar21 / (double)(int)uVar12);
      }
    }
  }
  else {
    uVar11 = 0;
  }
  return uVar11;
}

Assistant:

int av1_is_integer_mv(const YV12_BUFFER_CONFIG *cur_picture,
                      const YV12_BUFFER_CONFIG *last_picture,
                      ForceIntegerMVInfo *const force_intpel_info) {
  // check use hash ME
  int k;

  const int block_size = FORCE_INT_MV_DECISION_BLOCK_SIZE;
  const double threshold_current = 0.8;
  const double threshold_average = 0.95;
  const int max_history_size = 32;
  int T = 0;  // total block
  int C = 0;  // match with collocated block
  int S = 0;  // smooth region but not match with collocated block

  const int pic_width = cur_picture->y_width;
  const int pic_height = cur_picture->y_height;
  for (int i = 0; i + block_size <= pic_height; i += block_size) {
    for (int j = 0; j + block_size <= pic_width; j += block_size) {
      const int x_pos = j;
      const int y_pos = i;
      int match = 1;
      T++;

      // check whether collocated block match with current
      uint8_t *p_cur = cur_picture->y_buffer;
      uint8_t *p_ref = last_picture->y_buffer;
      int stride_cur = cur_picture->y_stride;
      int stride_ref = last_picture->y_stride;
      p_cur += (y_pos * stride_cur + x_pos);
      p_ref += (y_pos * stride_ref + x_pos);

      if (cur_picture->flags & YV12_FLAG_HIGHBITDEPTH) {
        uint16_t *p16_cur = CONVERT_TO_SHORTPTR(p_cur);
        uint16_t *p16_ref = CONVERT_TO_SHORTPTR(p_ref);
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p16_cur[tmpX] != p16_ref[tmpX]) {
              match = 0;
            }
          }
          p16_cur += stride_cur;
          p16_ref += stride_ref;
        }
      } else {
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p_cur[tmpX] != p_ref[tmpX]) {
              match = 0;
            }
          }
          p_cur += stride_cur;
          p_ref += stride_ref;
        }
      }

      if (match) {
        C++;
        continue;
      }

      if (av1_hash_is_horizontal_perfect(cur_picture, block_size, x_pos,
                                         y_pos) ||
          av1_hash_is_vertical_perfect(cur_picture, block_size, x_pos, y_pos)) {
        S++;
        continue;
      }
    }
  }

  assert(T > 0);
  double cs_rate = ((double)(C + S)) / ((double)(T));

  force_intpel_info->cs_rate_array[force_intpel_info->rate_index] = cs_rate;

  force_intpel_info->rate_index =
      (force_intpel_info->rate_index + 1) % max_history_size;
  force_intpel_info->rate_size++;
  force_intpel_info->rate_size =
      AOMMIN(force_intpel_info->rate_size, max_history_size);

  if (cs_rate < threshold_current) {
    return 0;
  }

  if (C == T) {
    return 1;
  }

  double cs_average = 0.0;

  for (k = 0; k < force_intpel_info->rate_size; k++) {
    cs_average += force_intpel_info->cs_rate_array[k];
  }
  cs_average /= force_intpel_info->rate_size;

  if (cs_average < threshold_average) {
    return 0;
  }

  if ((T - C - S) < 0) {
    return 1;
  }

  if (cs_average > 1.01) {
    return 1;
  }

  return 0;
}